

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void ping_pong_init(ping_pong *pp,int limit)

{
  memset(pp,0,0x130);
  pthread_mutex_init((pthread_mutex_t *)&pp->mutex,(pthread_mutexattr_t *)0x0);
  pthread_rwlock_init((pthread_rwlock_t *)&pp->rwmutex,(pthread_rwlockattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)pp->cond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)(pp->cond + 1),(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&pp->done_cond,(pthread_condattr_t *)0x0);
  pp->outstanding = 2;
  pp->limit = limit;
  return;
}

Assistant:

static void ping_pong_init (ping_pong *pp, int limit) {
	memset ((void *) pp, 0, sizeof (*pp));
	pthread_mutex_init (&pp->mutex, NULL);
	pthread_rwlock_init (&pp->rwmutex, NULL);
	pthread_cond_init (&pp->cond[0], NULL);
	pthread_cond_init (&pp->cond[1], NULL);
	pthread_cond_init (&pp->done_cond, NULL);
	pp->outstanding = 2;
	pp->limit = limit;
}